

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O1

void __thiscall tst_future::finally(tst_future *this)

{
  QSharedData *pQVar1;
  PromiseResolver<void> PVar2;
  PromiseResolver<int> PVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar4;
  bool bVar5;
  char cVar6;
  PromiseData<int> *this_00;
  PromiseDataBase<int,_void_(const_int_&)> *this_01;
  char *pcVar7;
  char *pcVar8;
  PromiseDataBase<void,_void_()> *this_02;
  QSharedData *pQVar9;
  QPromiseReject<int> *in_R8;
  char *reject;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  PromiseResolver<void> resolver_2;
  _Any_data local_148;
  undefined **local_138;
  PromiseData<int> *pPStack_130;
  QSharedData *local_120;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_100;
  PromiseResolver<int> resolver;
  _Manager_type local_e8;
  int value;
  QSharedData *local_d0;
  Type input;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_50;
  code *local_40;
  
  local_148._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_148._M_pod_data);
  QVar4 = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar9 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  *(undefined8 *)
   &((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00130b60;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00130af8;
  ((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)
   &((PromiseDataBase<QString,_void_(const_QString_&)> *)&this_00->m_value)->super_QSharedData = 0;
  LOCK();
  pQVar9 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar9->ref = (QAtomicInt)((int)pQVar9->ref + 1);
  UNLOCK();
  LOCK();
  pQVar9 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar9->ref = (QAtomicInt)((int)pQVar9->ref + 1);
  UNLOCK();
  local_120 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_148._M_unused._M_object = &PTR__QPromiseBase_00130ac0;
  local_148._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<QString>::PromiseResolver
            ((PromiseResolver<QString> *)&resolver,(QPromise<int> *)&local_148);
  local_148._M_unused._M_object = &PTR__QPromiseBase_00130698;
  if ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar9 = (QSharedData *)(local_148._8_8_ + 8);
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_148._8_8_ + 8))();
    }
  }
  PVar3.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_78._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_78._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    pcStack_60 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_98._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_98._M_unused._0_8_)->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_98._M_unused._0_8_ + 8))->d = (Data *)PVar3.m_d.d;
  if (PVar3.m_d.d == (Data *)0x0) {
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + 1;
    UNLOCK();
    pcStack_80 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (PVar3.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar3.m_d.d = *(int *)PVar3.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar3.m_d.d == 0) {
      operator_delete((void *)PVar3.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar9 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_01 = (PromiseDataBase<int,_void_(const_int_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130878;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_00130810;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_d0 = &this_01->super_QSharedData;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_001307d8;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver);
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       &PTR__QPromiseBase_00130570;
  if (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0) {
    LOCK();
    pQVar1 = &this_01->super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (this_01 != (PromiseDataBase<int,_void_(const_int_&)> *)0x0)) {
      (*this_01->_vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  resolver_2.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)resolver_1.m_d.d
  ;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_158 = resolver_1.m_d.d;
  local_148._M_unused._M_object = (void *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  local_148._8_8_ = resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  pPStack_130 = QVar4.d;
  LOCK();
  pQVar1 = &((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_138 = &PTR__QPromiseBase_001307d8;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x20);
  *(void **)local_b8._M_unused._0_8_ = local_148._M_unused._M_object;
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = local_148._8_8_;
  if ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00130570;
  *(PromiseData<int> **)((long)local_b8._M_unused._0_8_ + 0x18) = pPStack_130;
  if (pPStack_130 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_130->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_b8._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_001307d8;
  pcStack_a0 = std::
               _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(const_QString_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  local_138 = &PTR__QPromiseBase_00130570;
  if (pPStack_130 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_130->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (pPStack_130 != (PromiseData<int> *)0x0)) {
      (*(pPStack_130->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    *(int *)local_148._8_8_ = *(int *)local_148._8_8_ + -1;
    UNLOCK();
    if ((*(int *)local_148._8_8_ == 0) &&
       ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0)) {
      operator_delete((void *)local_148._8_8_,0x10);
    }
  }
  if ((Data *)local_148._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + -1;
    UNLOCK();
    if ((*local_148._M_unused._M_object == 0) && ((Data *)local_148._M_unused._0_8_ != (Data *)0x0))
    {
      operator_delete(local_148._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addHandler
            ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00,
             (function<void_(const_QString_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<QString,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<QString,decltype(nullptr),void> *)0x0,&resolver_2,
             (QPromiseResolve<int> *)&local_158,in_R8);
  QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::addCatcher
            ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_158.d != (Data *)0x0)) {
      operator_delete(local_158.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar5 = QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::isPending
                    ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
              ((PromiseDataBase<QString,_void_(const_QString_&)> *)this_00);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar4.d)
    ;
  }
  LOCK();
  (local_120->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_120->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_120->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  LOCK();
  (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar4.d)
    ;
  }
  QVar4.d = input.super_QPromiseBase<int>.m_d.d;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(input.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar5 = (bool)(~bVar5 & ((QVar4.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data
                          ._M_exception_object == (void *)0x0);
  local_148._M_pod_data[0] = bVar5;
  resolver.m_d.d._0_1_ = 1;
  pcVar7 = QTest::toString<bool>((bool *)local_148._M_pod_data);
  pcVar8 = QTest::toString<bool>((bool *)&resolver);
  cVar6 = QTest::compare_helper
                    (bVar5,"Compared values are not the same",pcVar7,pcVar8,"input.isFulfilled()",
                     "true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                     ,0x148);
  if (cVar6 != '\0') {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
    local_148._M_pod_data[0] = bVar5;
    resolver.m_d.d._0_1_ = 1;
    pcVar7 = QTest::toString<bool>((bool *)local_148._M_pod_data);
    pcVar8 = QTest::toString<bool>((bool *)&resolver);
    reject = "output.isPending()";
    cVar6 = QTest::compare_helper
                      (bVar5,"Compared values are not the same",pcVar7,pcVar8,"output.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                       ,0x149);
    if (cVar6 != '\0') {
      value = -1;
      this_02 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
      this_02->_vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&this_02->super_QSharedData = 0;
      (this_02->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_02->m_catchers).d.size = 0;
      (this_02->m_handlers).d.size = 0;
      (this_02->m_catchers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&this_02->m_lock = 0;
      *(undefined8 *)&this_02->m_settled = 0;
      (this_02->m_error).m_data._M_exception_object = (void *)0x0;
      this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130778;
      QReadWriteLock::QReadWriteLock(&this_02->m_lock,0);
      this_02->m_settled = false;
      (this_02->m_handlers).d.d = (Data *)0x0;
      (this_02->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (this_02->m_handlers).d.size = 0;
      (this_02->m_catchers).d.d = (Data *)0x0;
      (this_02->m_catchers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_02->m_catchers).d.size = 0;
      (this_02->m_error).m_data._M_exception_object = (void *)0x0;
      this_02->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00130700;
      LOCK();
      (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (this_02->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
           ._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar9 = &this_02->super_QSharedData;
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_001306c8;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver_2,(QPromise<void> *)&resolver_1);
      resolver_1.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           &PTR__QPromiseBase_00130540;
      if (this_02 != (PromiseDataBase<void,_void_()> *)0x0) {
        LOCK();
        pQVar1 = &this_02->super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (this_02 != (PromiseDataBase<void,_void_()> *)0x0)) {
          (*this_02->_vptr_PromiseDataBase[1])();
        }
      }
      PVar2.m_d.d = resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
      }
      local_158.d = (Data *)resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
      }
      local_100 = resolver_2.m_d.d;
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
        UNLOCK();
      }
      local_138 = (undefined **)0x0;
      pPStack_130 = (PromiseData<int> *)0x0;
      local_148._M_unused._M_object = (_func_int **)0x0;
      local_148._8_8_ = (PromiseData<int> *)0x0;
      local_148._M_unused._M_object = operator_new(0x18);
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      local_148._M_unused._0_8_)->d = (Data *)PVar2.m_d.d;
      if (PVar2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
        UNLOCK();
      }
      ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
      ((long)local_148._M_unused._0_8_ + 8))->d = (Data *)PVar2.m_d.d;
      if (PVar2.m_d.d == (Data *)0x0) {
        ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
        ((long)local_148._M_unused._0_8_ + 0x10))->d = (Data *)&value;
        pPStack_130 = (PromiseData<int> *)
                      std::
                      _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                      ::_M_invoke;
        local_138 = (undefined **)
                    std::
                    _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                    ::_M_manager;
      }
      else {
        LOCK();
        *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + 1;
        UNLOCK();
        ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
        ((long)local_148._M_unused._0_8_ + 0x10))->d = (Data *)&value;
        pPStack_130 = (PromiseData<int> *)
                      std::
                      _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                      ::_M_invoke;
        local_138 = (undefined **)
                    std::
                    _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                    ::_M_manager;
        LOCK();
        *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar2.m_d.d == 0) {
          operator_delete((void *)PVar2.m_d.d,0x10);
        }
      }
      if (PVar2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)PVar2.m_d.d = *(int *)PVar2.m_d.d + -1;
        UNLOCK();
        if (*(int *)PVar2.m_d.d == 0) {
          operator_delete((void *)PVar2.m_d.d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (this_01,(function<void_(const_int_&)> *)&local_148);
      if (local_138 != (undefined **)0x0) {
        (*(code *)local_138)(&local_148,&local_148,__destroy_functor);
      }
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_158,
                 (QPromiseResolve<void> *)&local_100,(QPromiseReject<void> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (this_01,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&resolver);
      if (local_e8 != (_Manager_type)0x0) {
        (*local_e8)((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
      }
      if (local_100.d != (Data *)0x0) {
        LOCK();
        ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             ((local_100.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (local_100.d != (Data *)0x0)) {
          operator_delete(local_100.d,0x10);
        }
      }
      if (local_158.d != (Data *)0x0) {
        LOCK();
        ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
           (local_158.d != (Data *)0x0)) {
          operator_delete(local_158.d,0x10);
        }
      }
      if (resolver_2.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver_2.m_d.d == 0) && (resolver_2.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver_2.m_d.d,0x10);
        }
      }
      bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
      if (!bVar5) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch(this_01);
      }
      bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
      while (bVar5 != false) {
        QCoreApplication::processEvents();
        QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
        bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(this_02);
      }
      LOCK();
      (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_02->_vptr_PromiseDataBase[1])(this_02);
      }
      LOCK();
      (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*this_02->_vptr_PromiseDataBase[1])(this_02);
      }
      bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending(this_01);
      bVar5 = (bool)(~bVar5 & (this_01->m_error).m_data._M_exception_object == (void *)0x0);
      resolver_1.m_d.d._0_1_ = bVar5;
      resolver_2.m_d.d._0_1_ = 1;
      pcVar7 = QTest::toString<bool>((bool *)&resolver_1);
      pcVar8 = QTest::toString<bool>((bool *)&resolver_2);
      cVar6 = QTest::compare_helper
                        (bVar5,"Compared values are not the same",pcVar7,pcVar8,
                         "output.isFulfilled()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                         ,0x152);
      if (cVar6 != '\0') {
        QTest::qCompare(value,0x2a,"value","42",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                        ,0x153);
      }
    }
  }
  LOCK();
  (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_d0->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00130570;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar9 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar9->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_future::finally()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            return QString{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    int value = -1;
    output
        .then([&](int res) {
            value = res;
        })
        .wait();

    QCOMPARE(output.isFulfilled(), true);
    QCOMPARE(value, 42);
}